

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O3

int VP8Decimate(VP8EncIterator *it,VP8ModeScore *rd,VP8RDLevel rd_opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  ushort uVar8;
  byte *pbVar9;
  DError *paaiVar10;
  undefined8 uVar11;
  bool bVar12;
  ushort uVar13;
  int iVar14;
  uint32_t uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint16_t *puVar25;
  VP8MBInfo *pVVar26;
  uint uVar27;
  int16_t *piVar28;
  long lVar29;
  uint8_t *puVar30;
  undefined1 *puVar31;
  ushort uVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  uint8_t *puVar36;
  uint8_t *puVar37;
  ushort uVar38;
  uint8_t *puVar39;
  uint8_t *puVar40;
  uint8_t *puVar41;
  ulong uVar42;
  VP8ModeScore *rd_00;
  VP8ModeScore *pVVar43;
  VP8Encoder *pVVar44;
  uint8_t *puVar45;
  ulong uVar46;
  score_t sVar47;
  VP8ModeScore *__src;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint8_t *best_blocks;
  uint32_t v;
  long local_478;
  long local_470;
  long local_460;
  undefined1 local_458 [16];
  long local_438;
  long local_400;
  long local_3f8;
  long local_3f0;
  ulong local_3e8;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  long local_388;
  undefined8 local_360 [64];
  undefined1 local_160 [2];
  undefined1 local_15e [278];
  uint local_48;
  int8_t local_44 [3];
  int8_t local_40 [16];
  
  iVar21 = it->enc_->method_;
  rd->nz = 0;
  rd->D = 0;
  rd->SD = 0;
  rd->H = 0;
  rd->R = 0;
  rd->score = 0x7fffffffffffff;
  if (it->x_ == 0) {
    puVar39 = (uint8_t *)0x0;
  }
  else {
    puVar39 = it->y_left_;
  }
  local_438 = 0x7fffffffffffff;
  if (it->y_ == 0) {
    puVar30 = (uint8_t *)0x0;
  }
  else {
    puVar30 = it->y_top_;
  }
  (*VP8EncPredLuma16)(it->yuv_p_,puVar39,puVar30);
  if (it->x_ == 0) {
    puVar39 = (uint8_t *)0x0;
  }
  else {
    puVar39 = it->u_left_;
  }
  if (it->y_ == 0) {
    puVar30 = (uint8_t *)0x0;
  }
  else {
    puVar30 = it->uv_top_;
  }
  (*VP8EncPredChroma8)(it->yuv_p_,puVar39,puVar30);
  if (rd_opt != RD_OPT_NONE) {
    it->do_trellis_ = (uint)(RD_OPT_TRELLIS < rd_opt);
    pbVar9 = it->yuv_in_;
    pVVar44 = it->enc_;
    uVar27 = *(byte *)it->mb_ >> 5 & 3;
    lVar22 = (long)pVVar44->dqm_[uVar27].lambda_i16_;
    local_458._8_8_ = local_458._0_8_;
    local_458._0_8_ = lVar22;
    iVar19 = pVVar44->dqm_[uVar27].tlambda_;
    iVar14 = (uint)*pbVar9 * 0x1010101;
    local_3a8._0_4_ = iVar14;
    bVar48 = false;
    lVar23 = 0;
    do {
      bVar12 = bVar48;
      if ((((*(int *)(pbVar9 + lVar23) != iVar14) || (*(int *)(pbVar9 + lVar23 + 4) != iVar14)) ||
          (*(int *)(pbVar9 + lVar23 + 8) != iVar14)) ||
         (bVar12 = false, *(int *)(pbVar9 + lVar23 + 0xc) != iVar14)) goto LAB_0013b2e4;
      lVar23 = lVar23 + 0x20;
    } while ((int)lVar23 != 0x200);
    bVar12 = true;
LAB_0013b2e4:
    rd->mode_i16 = -1;
    lVar23 = 0;
    rd_00 = (VP8ModeScore *)local_3a8;
    __src = rd;
    do {
      puVar39 = it->yuv_out2_;
      rd_00->mode_i16 = (int)lVar23;
      uVar15 = ReconstructIntra16(it,rd_00,puVar39,(int)lVar23);
      rd_00->nz = uVar15;
      iVar14 = (*VP8SSE16x16)(pbVar9,puVar39);
      rd_00->D = (long)iVar14;
      if (iVar19 == 0) {
        lVar24 = 0;
      }
      else {
        iVar14 = (*VP8TDisto16x16)(pbVar9,puVar39,kWeightY);
        lVar24 = (long)(iVar14 * iVar19 + 0x80 >> 8);
      }
      rd_00->SD = lVar24;
      rd_00->H = (ulong)VP8FixedCostsI16[lVar23];
      iVar14 = VP8GetCostLuma16(it,rd_00);
      rd_00->R = (long)iVar14;
      if (bVar12) {
        piVar28 = rd_00->y_ac_levels[0] + 1;
        iVar33 = 0;
        uVar20 = 0x10;
        do {
          lVar24 = 0;
          do {
            bVar48 = SCARRY4((uint)(piVar28[lVar24] != 0),iVar33);
            iVar33 = (uint)(piVar28[lVar24] != 0) + iVar33;
            if (iVar33 != 0 && bVar48 == iVar33 < 0) goto LAB_0013b3f5;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0xf);
          piVar28 = piVar28 + 0x10;
          bVar48 = 1 < uVar20;
          uVar20 = uVar20 - 1;
        } while (bVar48);
        rd_00->D = rd_00->D * 2;
        rd_00->SD = rd_00->SD * 2;
        bVar12 = true;
      }
      else {
LAB_0013b3f5:
        bVar12 = false;
      }
      lVar24 = (rd_00->SD + rd_00->D) * 0x100 + ((long)iVar14 + rd_00->H) * lVar22;
      rd_00->score = lVar24;
      if ((lVar23 == 0) || (pVVar43 = rd_00, lVar24 < __src->score)) {
        uVar1 = it->yuv_out_;
        uVar4 = it->yuv_out2_;
        auVar49._8_4_ = (int)uVar1;
        auVar49._0_8_ = uVar4;
        auVar49._12_4_ = (int)((ulong)uVar1 >> 0x20);
        it->yuv_out_ = (uint8_t *)uVar4;
        it->yuv_out2_ = (uint8_t *)auVar49._8_8_;
        pVVar43 = __src;
        __src = rd_00;
      }
      lVar23 = lVar23 + 1;
      rd_00 = pVVar43;
    } while (lVar23 != 4);
    if (__src != rd) {
      memcpy(rd,__src,0x370);
    }
    rd->score = (rd->SD + rd->D) * 0x100 +
                (rd->H + rd->R) * (long)pVVar44->dqm_[uVar27].lambda_mode_;
    VP8SetIntra16Mode(it,rd->mode_i16);
    if (((rd->nz & 0x100ffff) == 0x1000000) && ((long)pVVar44->dqm_[uVar27].min_disto_ < rd->D)) {
      uVar13 = rd->y_dc_levels[1];
      uVar8 = rd->y_dc_levels[2];
      uVar32 = -uVar13;
      if (0 < (short)uVar13) {
        uVar32 = uVar13;
      }
      uVar13 = -uVar8;
      if (0 < (short)uVar8) {
        uVar13 = uVar8;
      }
      uVar8 = rd->y_dc_levels[4];
      uVar38 = -uVar8;
      if (0 < (short)uVar8) {
        uVar38 = uVar8;
      }
      if (uVar32 < uVar13) {
        uVar32 = uVar13;
      }
      if (uVar38 <= uVar32) {
        uVar38 = uVar32;
      }
      if (pVVar44->dqm_[uVar27].max_edge_ < (int)(uint)uVar38) {
        pVVar44->dqm_[uVar27].max_edge_ = (uint)uVar38;
      }
    }
    pVVar44 = it->enc_;
    pVVar26 = it->mb_;
    puVar39 = it->yuv_in_;
    puVar30 = it->yuv_out2_;
    if (1 < iVar21) {
      if (pVVar44->max_i4_header_bits_ != 0) {
        uVar27 = *(byte *)pVVar26 >> 5 & 3;
        lVar22 = (long)pVVar44->dqm_[uVar27].lambda_i4_;
        iVar21 = pVVar44->dqm_[uVar27].tlambda_;
        local_48 = 0;
        local_3a8 = (undefined1  [16])0x0;
        local_398 = ZEXT816(0xd3);
        local_388 = (long)pVVar44->dqm_[uVar27].lambda_mode_ * 0xd3;
        VP8IteratorStartI4(it);
        puVar41 = rd->modes_i4;
        iVar19 = 0;
        do {
          uVar13 = VP8Scan[it->i4_];
          puVar40 = puVar39 + uVar13;
          puVar25 = GetCostModeI4(it,puVar41);
          puVar45 = puVar30 + uVar13;
          puVar36 = it->yuv_p_;
          (*VP8EncPredLuma4)(puVar36,it->i4_top_);
          local_458._0_4_ = 0xffffffff;
          lVar24 = 0;
          local_3f8 = 0;
          local_3f0 = 0;
          local_3e8 = 0;
          uVar20 = 0;
          lVar23 = 0x7fffffffffffff;
          local_400 = 0;
          puVar36 = puVar36 + 0x688;
          do {
            iVar33 = ReconstructIntra4(it,(int16_t *)&local_3c8,puVar40,puVar36,(int)lVar24);
            iVar14 = it->i4_;
            iVar16 = (*VP8SSE4x4)(puVar40,puVar36);
            if (iVar21 == 0) {
              lVar34 = 0;
            }
            else {
              iVar17 = (*VP8TDisto4x4)(puVar40,puVar36,kWeightY);
              lVar34 = (long)(iVar17 * iVar21 + 0x80 >> 8);
            }
            uVar42 = (ulong)puVar25[lVar24];
            if (lVar24 == 0) {
LAB_0013b718:
              lVar29 = 0;
            }
            else {
              uVar18 = 0;
              lVar29 = 1;
              do {
                uVar18 = (uVar18 + 1) - (uint)(*(short *)((long)&local_3c8 + lVar29 * 2) == 0);
                if (3 < uVar18) goto LAB_0013b718;
                lVar29 = lVar29 + 1;
              } while (lVar29 != 0x10);
              lVar29 = 0x8c;
            }
            lVar35 = (lVar34 + iVar16) * 0x100;
            puVar37 = puVar36;
            if (((int)local_458._0_4_ < 0) || ((long)((uVar42 + lVar29) * lVar22 + lVar35) < lVar23)
               ) {
              iVar17 = VP8GetCostLuma4(it,(int16_t *)&local_3c8);
              lVar35 = (uVar42 + lVar29 + iVar17) * lVar22 + lVar35;
              if (((int)local_458._0_4_ < 0) || (lVar35 < lVar23)) {
                lVar23 = (long)it->i4_;
                local_360[lVar23 * 4 + 2] = local_3b8;
                local_360[lVar23 * 4 + 3] = uStack_3b0;
                local_360[lVar23 * 4] = local_3c8;
                local_360[lVar23 * 4 + 1] = uStack_3c0;
                local_458._0_4_ = (int)lVar24;
                lVar23 = lVar35;
                puVar37 = puVar45;
                puVar45 = puVar36;
                local_400 = lVar29 + iVar17;
                local_3f8 = (long)iVar16;
                local_3f0 = lVar34;
                local_3e8 = uVar42;
                uVar20 = iVar33 << ((byte)iVar14 & 0x1f);
              }
            }
            lVar24 = lVar24 + 1;
            puVar36 = puVar37;
          } while (lVar24 != 10);
          local_3a8._8_8_ = local_3a8._8_8_ + local_3f0;
          local_3a8._0_8_ = local_3a8._0_8_ + local_3f8;
          local_398._8_8_ = local_398._8_8_ + local_400;
          local_398._0_8_ = local_398._0_8_ + local_3e8;
          local_48 = local_48 | uVar20;
          local_388 = (local_3f8 + local_3f0) * 0x100 +
                      (local_3e8 + local_400) * (long)pVVar44->dqm_[uVar27].lambda_mode_ + local_388
          ;
          if ((rd->score <= local_388) ||
             (iVar19 = iVar19 + (int)local_3e8, pVVar44->max_i4_header_bits_ < iVar19))
          goto LAB_0013b9c9;
          lVar23 = (long)it->i4_;
          if (puVar45 != puVar30 + VP8Scan[lVar23]) {
            (*VP8Copy4x4)(puVar45,puVar30 + VP8Scan[lVar23]);
            lVar23 = (long)it->i4_;
          }
          puVar41[lVar23] = local_458[0];
          it->left_nz_[it->i4_ >> 2] = (uint)(uVar20 != 0);
          it->top_nz_[it->i4_ & 3] = (uint)(uVar20 != 0);
          iVar14 = VP8IteratorRotateI4(it,puVar30);
        } while (iVar14 != 0);
        rd->D = local_3a8._0_8_;
        rd->SD = local_3a8._8_8_;
        rd->H = local_398._0_8_;
        rd->R = local_398._8_8_;
        rd->nz = local_48;
        rd->score = local_388;
        VP8SetIntra4Mode(it,puVar41);
        uVar2 = it->yuv_out_;
        uVar5 = it->yuv_out2_;
        auVar50._8_4_ = (int)uVar2;
        auVar50._0_8_ = uVar5;
        auVar50._12_4_ = (int)((ulong)uVar2 >> 0x20);
        it->yuv_out_ = (uint8_t *)uVar5;
        it->yuv_out2_ = (uint8_t *)auVar50._8_8_;
        memcpy(rd->y_ac_levels,local_360,0x200);
      }
LAB_0013b9c9:
      pVVar44 = it->enc_;
      pVVar26 = it->mb_;
      puVar39 = it->yuv_in_;
      puVar30 = it->yuv_out2_;
    }
    iVar21 = pVVar44->dqm_[*(byte *)pVVar26 >> 5 & 3].lambda_uv_;
    puVar30 = puVar30 + 0x10;
    puVar40 = it->yuv_out_ + 0x10;
    rd->mode_uv = -1;
    local_458 = (undefined1  [16])0x0;
    lVar22 = 0;
    local_460 = 0;
    uVar27 = 0;
    local_478 = 0;
    puVar41 = puVar40;
    do {
      local_48 = ReconstructUV(it,(VP8ModeScore *)local_3a8,puVar30,(int)lVar22);
      iVar19 = (*VP8SSE16x8)(puVar39 + 0x10,puVar30);
      auVar49 = local_398;
      local_3a8._8_8_ = 0;
      local_3a8._0_8_ = (long)iVar19;
      local_398._2_6_ = 0;
      local_398._0_2_ = VP8FixedCostsUV[lVar22];
      local_398._8_8_ = auVar49._8_8_;
      iVar19 = VP8GetCostUV(it,(VP8ModeScore *)local_3a8);
      uVar20 = local_48;
      lVar23 = (long)iVar19;
      if (lVar22 != 0) {
        iVar19 = 0;
        puVar31 = local_15e;
        uVar18 = 8;
        do {
          lVar24 = 0;
          do {
            iVar19 = (iVar19 + 1) - (uint)(*(short *)(puVar31 + lVar24 * 2) == 0);
            if (2 < iVar19) goto LAB_0013bb2c;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0xf);
          puVar31 = puVar31 + 0x20;
          bVar48 = 1 < uVar18;
          uVar18 = uVar18 - 1;
        } while (bVar48);
        lVar23 = lVar23 + 0x460;
      }
LAB_0013bb2c:
      uVar11 = local_398._0_8_;
      lVar24 = (local_3a8._8_8_ + local_3a8._0_8_) * 0x100 +
               (local_398._0_8_ + lVar23) * (long)iVar21;
      if ((lVar22 == 0) || (puVar36 = puVar41, lVar24 < local_438)) {
        local_458 = local_3a8;
        rd->mode_uv = (int)lVar22;
        memcpy(rd->uv_levels,local_160,0x100);
        if (it->top_derr_ != (DError *)0x0) {
          *(undefined2 *)(rd->derr[1] + 1) = local_40._0_2_;
          *(undefined4 *)rd->derr = _local_44;
        }
        local_478 = uVar11;
        puVar36 = puVar30;
        puVar30 = puVar41;
        local_460 = lVar23;
        local_438 = lVar24;
        uVar27 = uVar20;
      }
      lVar22 = lVar22 + 1;
      puVar41 = puVar36;
    } while (lVar22 != 4);
    VP8SetIntraUVMode(it,rd->mode_uv);
    rd->D = rd->D + local_458._0_8_;
    rd->SD = rd->SD + local_458._8_8_;
    rd->R = rd->R + local_460;
    rd->H = rd->H + local_478;
    rd->nz = rd->nz | uVar27;
    rd->score = rd->score + local_438;
    if (puVar36 != puVar40) {
      (*VP8Copy16x8)(puVar36,puVar40);
    }
    if (it->top_derr_ != (DError *)0x0) {
      lVar22 = 0;
      bVar48 = true;
      do {
        bVar12 = bVar48;
        iVar21 = it->x_;
        paaiVar10 = it->top_derr_;
        it->left_derr_[lVar22][0] = rd->derr[lVar22][0];
        it->left_derr_[lVar22][1] = (int8_t)((uint)(rd->derr[lVar22][2] * 3) >> 2);
        paaiVar10[iVar21][lVar22][0] = rd->derr[lVar22][1];
        paaiVar10[iVar21][lVar22][1] = rd->derr[lVar22][2] - it->left_derr_[lVar22][1];
        lVar22 = 1;
        bVar48 = false;
      } while (bVar12);
    }
    if (rd_opt == RD_OPT_TRELLIS) {
      it->do_trellis_ = 1;
      if (((uint)*it->mb_ & 3) == 1) {
        uVar20 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
      }
      else {
        pVVar44 = it->enc_;
        VP8IteratorStartI4(it);
        uVar20 = 0;
        do {
          uVar27 = it->i4_;
          uVar13 = VP8Scan[(int)uVar27];
          bVar7 = it->preds_[(int)(((int)uVar27 >> 2) * pVVar44->preds_w_ + (uVar27 & 3))];
          puVar39 = it->yuv_in_;
          puVar30 = it->yuv_out_;
          (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
          iVar21 = ReconstructIntra4(it,rd->y_ac_levels[it->i4_],puVar39 + uVar13,puVar30 + uVar13,
                                     (uint)bVar7);
          uVar20 = uVar20 | iVar21 << ((byte)it->i4_ & 0x1f);
          iVar21 = VP8IteratorRotateI4(it,it->yuv_out_);
        } while (iVar21 != 0);
      }
      uVar27 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
      uVar27 = uVar27 | uVar20;
      rd->nz = uVar27;
    }
    else {
      uVar27 = rd->nz;
    }
    goto LAB_0013c214;
  }
  bVar7 = *(byte *)it->mb_;
  if (iVar21 < 2) {
    sVar47 = it->enc_->dqm_[bVar7 >> 5 & 3].i4_penalty_;
    local_478 = 0x7fffffffffffff;
    local_470 = 0x7fffffffffffff;
    if ((bVar7 & 3) == 1) goto LAB_0013bd87;
LAB_0013be4d:
    VP8IteratorStartI4(it);
    puVar39 = rd->modes_i4;
    local_458._0_8_ = 0;
    uVar20 = 0;
    do {
      uVar13 = VP8Scan[it->i4_];
      puVar30 = it->yuv_in_;
      puVar25 = GetCostModeI4(it,puVar39);
      (*VP8EncPredLuma4)(it->yuv_p_,it->i4_top_);
      uVar42 = 0xffffffff;
      uVar46 = 0;
      lVar22 = 0x7fffffffffffff;
      do {
        iVar19 = (*VP8SSE4x4)(puVar30 + uVar13,it->yuv_p_ + VP8I4ModeOffsets[uVar46]);
        lVar23 = (ulong)puVar25[uVar46] * 0xb + (long)iVar19 * 0x100;
        if (lVar23 < lVar22) {
          uVar42 = uVar46 & 0xffffffff;
        }
        if (lVar22 < lVar23) {
          lVar23 = lVar22;
        }
        uVar46 = uVar46 + 1;
        lVar22 = lVar23;
      } while (uVar46 != 10);
      uVar8 = puVar25[(int)uVar42];
      puVar39[it->i4_] = (uint8_t)uVar42;
      sVar47 = sVar47 + lVar23;
      if ((local_470 <= sVar47) ||
         (local_458._0_8_ = local_458._0_8_ + (ulong)uVar8, local_478 < (long)local_458._0_8_))
      goto LAB_0013c137;
      iVar19 = ReconstructIntra4(it,rd->y_ac_levels[it->i4_],puVar30 + uVar13,
                                 it->yuv_out2_ + VP8Scan[it->i4_],(int)uVar42);
      uVar20 = uVar20 | iVar19 << ((byte)it->i4_ & 0x1f);
      iVar19 = VP8IteratorRotateI4(it,it->yuv_out2_);
    } while (iVar19 != 0);
    VP8SetIntra4Mode(it,puVar39);
    uVar3 = it->yuv_out_;
    uVar6 = it->yuv_out2_;
    auVar51._8_4_ = (int)uVar3;
    auVar51._0_8_ = uVar6;
    auVar51._12_4_ = (int)((ulong)uVar3 >> 0x20);
    it->yuv_out_ = (uint8_t *)uVar6;
    it->yuv_out2_ = (uint8_t *)auVar51._8_8_;
    local_470 = sVar47;
  }
  else {
    sVar47 = it->enc_->dqm_[bVar7 >> 5 & 3].i4_penalty_;
    local_478 = (long)it->enc_->mb_header_limit_;
LAB_0013bd87:
    pbVar9 = it->yuv_in_;
    iVar19 = -1;
    lVar23 = 0;
    lVar22 = 0x7fffffffffffff;
    do {
      iVar14 = (*VP8SSE16x16)(pbVar9,it->yuv_p_ + VP8I16ModeOffsets[lVar23]);
      local_470 = (ulong)VP8FixedCostsI16[lVar23] * 0x6a + (long)iVar14 * 0x100;
      iVar14 = (int)lVar23;
      if (lVar22 <= local_470) {
        local_470 = lVar22;
        iVar14 = iVar19;
      }
      if (lVar23 != 0 && local_478 < (long)(ulong)VP8FixedCostsI16[lVar23]) {
        local_470 = lVar22;
        iVar14 = iVar19;
      }
      iVar19 = iVar14;
      lVar23 = lVar23 + 1;
      lVar22 = local_470;
    } while (lVar23 != 4);
    if ((it->x_ == 0) || (it->y_ == 0)) {
      iVar14 = (uint)*pbVar9 * 0x1010101;
      local_3a8._0_4_ = iVar14;
      lVar22 = 0;
      do {
        if ((((*(int *)(pbVar9 + lVar22) != iVar14) || (*(int *)(pbVar9 + lVar22 + 4) != iVar14)) ||
            (*(int *)(pbVar9 + lVar22 + 8) != iVar14)) ||
           (*(int *)(pbVar9 + lVar22 + 0xc) != iVar14)) goto LAB_0013be36;
        lVar22 = lVar22 + 0x20;
      } while ((int)lVar22 != 0x200);
      VP8SetIntra16Mode(it,(uint)(it->x_ != 0) * 2);
    }
    else {
LAB_0013be36:
      VP8SetIntra16Mode(it,iVar19);
      if (1 < iVar21) goto LAB_0013be4d;
    }
LAB_0013c137:
    uVar20 = ReconstructIntra16(it,rd,it->yuv_out_,(uint)*it->preds_);
  }
  if (0 < iVar21) {
    puVar39 = it->yuv_in_;
    uVar46 = 0xffffffff;
    uVar42 = 0;
    lVar22 = 0x7fffffffffffff;
    do {
      iVar21 = (*VP8SSE16x8)(puVar39 + 0x10,it->yuv_p_ + VP8UVModeOffsets[uVar42]);
      lVar23 = (ulong)VP8FixedCostsUV[uVar42] * 0x78 + (long)iVar21 * 0x100;
      if (lVar23 < lVar22) {
        uVar46 = uVar42 & 0xffffffff;
      }
      if (lVar23 <= lVar22) {
        lVar22 = lVar23;
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 != 4);
    VP8SetIntraUVMode(it,(int)uVar46);
  }
  uVar27 = ReconstructUV(it,rd,it->yuv_out_ + 0x10,(uint)*it->mb_ >> 2 & 3);
  uVar27 = uVar27 | uVar20;
  rd->nz = uVar27;
  rd->score = local_470;
LAB_0013c214:
  VP8SetSkip(it,(uint)(uVar27 == 0));
  return (uint)(uVar27 == 0);
}

Assistant:

int VP8Decimate(VP8EncIterator* const it, VP8ModeScore* const rd,
                VP8RDLevel rd_opt) {
  int is_skipped;
  const int method = it->enc_->method_;

  InitScore(rd);

  // We can perform predictions for Luma16x16 and Chroma8x8 already.
  // Luma4x4 predictions needs to be done as-we-go.
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);

  if (rd_opt > RD_OPT_NONE) {
    it->do_trellis_ = (rd_opt >= RD_OPT_TRELLIS_ALL);
    PickBestIntra16(it, rd);
    if (method >= 2) {
      PickBestIntra4(it, rd);
    }
    PickBestUV(it, rd);
    if (rd_opt == RD_OPT_TRELLIS) {   // finish off with trellis-optim now
      it->do_trellis_ = 1;
      SimpleQuantize(it, rd);
    }
  } else {
    // At this point we have heuristically decided intra16 / intra4.
    // For method >= 2, pick the best intra4/intra16 based on SSE (~tad slower).
    // For method <= 1, we don't re-examine the decision but just go ahead with
    // quantization/reconstruction.
    RefineUsingDistortion(it, (method >= 2), (method >= 1), rd);
  }
  is_skipped = (rd->nz == 0);
  VP8SetSkip(it, is_skipped);
  return is_skipped;
}